

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int NET_ParseUrl(char *url,char *proto,char *host,int *port,char *fn)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  bool bVar4;
  ulong local_68;
  size_t icount;
  int isftp;
  char *thost;
  char *ptrstr;
  char *urlcopyorig;
  char *urlcopy;
  char *fn_local;
  int *port_local;
  char *host_local;
  char *proto_local;
  char *url_local;
  
  sVar2 = strlen(url);
  __dest = (char *)malloc(sVar2 + 1);
  strcpy(__dest,url);
  *port = 0x50;
  strcpy(proto,"http:");
  strcpy(host,"localhost");
  strcpy(fn,"/");
  pcVar3 = strstr(__dest,"http:");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr(__dest,"root:");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(__dest,"ftp:");
      urlcopyorig = __dest;
      if (pcVar3 != (char *)0x0) {
        if (pcVar3 != __dest) {
          free(__dest);
          return 1;
        }
        strcpy(proto,"ftp:");
        *port = 0x15;
        urlcopyorig = __dest + 4;
      }
    }
    else {
      if (pcVar3 != __dest) {
        free(__dest);
        return 1;
      }
      urlcopyorig = __dest + 5;
    }
  }
  else {
    if (pcVar3 != __dest) {
      free(__dest);
      return 1;
    }
    urlcopyorig = __dest + 5;
  }
  if ((*urlcopyorig == '/') && (urlcopyorig[1] == '/')) {
    urlcopyorig = urlcopyorig + 2;
  }
  pcVar3 = urlcopyorig;
  iVar1 = strcmp(proto,"http:");
  if (iVar1 == 0) {
    pcVar3 = strchr(urlcopyorig,0x40);
    if (pcVar3 != (char *)0x0) {
      urlcopyorig = pcVar3 + 1;
    }
    pcVar3 = urlcopyorig;
    local_68 = 0;
    while( true ) {
      bVar4 = false;
      if ((*urlcopyorig != '/') && (bVar4 = false, *urlcopyorig != ':')) {
        bVar4 = *urlcopyorig != '\0';
      }
      if (!bVar4) break;
      urlcopyorig = urlcopyorig + 1;
      local_68 = local_68 + 1;
    }
    if (99 < local_68) {
      free(__dest);
      return 1;
    }
    strncpy(host,pcVar3,local_68);
    host[local_68] = '\0';
    if (*urlcopyorig == ':') {
      urlcopyorig = urlcopyorig + 1;
      __isoc99_sscanf(urlcopyorig,"%d",port);
      while( true ) {
        bVar4 = false;
        if (*urlcopyorig != '/') {
          bVar4 = *urlcopyorig != '\0';
        }
        if (!bVar4) break;
        urlcopyorig = urlcopyorig + 1;
      }
    }
  }
  else {
    local_68 = 0;
    while( true ) {
      bVar4 = false;
      if (*urlcopyorig != '/') {
        bVar4 = *urlcopyorig != '\0';
      }
      if (!bVar4) break;
      urlcopyorig = urlcopyorig + 1;
      local_68 = local_68 + 1;
    }
    if (99 < local_68) {
      free(__dest);
      return 1;
    }
    strncpy(host,pcVar3,local_68);
    host[local_68] = '\0';
  }
  if (*urlcopyorig != '\0') {
    sVar2 = strlen(urlcopyorig);
    if (0x4af < sVar2) {
      free(__dest);
      return 1;
    }
    strcpy(fn,urlcopyorig);
  }
  free(__dest);
  return 0;
}

Assistant:

static int NET_ParseUrl(const char *url, char *proto, char *host, int *port, 
		 char *fn)
{
  /* parses urls into their bits */
  /* returns 1 if error, else 0 */

  char *urlcopy, *urlcopyorig;
  char *ptrstr;
  char *thost;
  int isftp = 0;
  size_t icount;

  /* figure out if there is a http: or  ftp: */

  urlcopyorig = urlcopy = (char *) malloc(strlen(url)+1);
  strcpy(urlcopy,url);

  /* set some defaults */
  *port = 80;
  strcpy(proto,"http:");
  strcpy(host,"localhost");
  strcpy(fn,"/");
  
  ptrstr = strstr(urlcopy,"http:");
  if (ptrstr == NULL) {
    /* Nope, not http: */
    ptrstr = strstr(urlcopy,"root:");
    if (ptrstr == NULL) {
      /* Nope, not root either */
      ptrstr = strstr(urlcopy,"ftp:");
      if (ptrstr != NULL) {
	if (ptrstr == urlcopy) {
	  strcpy(proto,"ftp:");
	  *port = 21;
	  isftp++;
	  urlcopy += 4; /* move past ftp: */
	} else {
	  /* not at the beginning, bad url */
	  free(urlcopyorig);
	  return 1;
	}
      }
    } else {
      if (ptrstr == urlcopy) {
	urlcopy += 5; /* move past root: */
      } else {
	/* not at the beginning, bad url */
	free(urlcopyorig);
	return 1;
      }
    }
  } else {
    if (ptrstr == urlcopy) {
      urlcopy += 5; /* move past http: */
    } else {
      free(urlcopyorig);
      return 1;
    }
  }

  /* got the protocol */
  /* get the hostname */
  if (urlcopy[0] == '/' && urlcopy[1] == '/') {
    /* we have a hostname */
    urlcopy += 2; /* move past the // */
  }
  /* do this only if http */
  if (!strcmp(proto,"http:")) {

    /* Move past any user:password */
    if ((thost = strchr(urlcopy, '@')) != NULL)
      urlcopy = thost+1;

    thost = urlcopy;
    icount=0;
    while (*urlcopy != '/' && *urlcopy != ':' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    
    /* we should either be at the end of the string, have a /, or have a : */
    if (*urlcopy == ':') {
      /* follows a port number */
      urlcopy++;
      sscanf(urlcopy,"%d",port);
      while (*urlcopy != '/' && *urlcopy) urlcopy++; /* step to the */
    }
  } else {
    /* do this for ftp */
    
    thost = urlcopy;
    icount = 0;
    while (*urlcopy != '/' && *urlcopy) {
      urlcopy++;
      icount++;
    }
    if (icount > SHORTLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strncpy(host,thost,icount);
    host[icount] = '\0';
    /* Now, we should either be at the end of the string, or have a / */
    
  }
  /* Now the rest is a fn */

  if (*urlcopy) {
    if (strlen(urlcopy) > MAXLEN-1)
    {
       free(urlcopyorig);
       return 1;
    }
    strcpy(fn,urlcopy);
  }
  free(urlcopyorig);
  return 0;
}